

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TToString.h
# Opt level: O2

string * duckdb_apache::thrift::to_string<long>
                   (string *__return_storage_ptr__,vector<long,_true> *t)

{
  ostream *poVar1;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> *in_RCX;
  ostringstream o;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> local_1c0;
  pointer local_1b8;
  string local_1b0;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"[");
  local_1b8 = (t->super_vector<long,_std::allocator<long>_>).
              super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_start;
  local_1c0._M_current =
       (t->super_vector<long,_std::allocator<long>_>).
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
  to_string<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>
            (&local_1b0,(thrift *)&local_1b8,&local_1c0,in_RCX);
  poVar1 = std::operator<<(poVar1,(string *)&local_1b0);
  std::operator<<(poVar1,"]");
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const duckdb::vector<T>& t) {
  std::ostringstream o;
  o << "[" << to_string(t.begin(), t.end()) << "]";
  return o.str();
}